

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

CURLcode add_parallel_transfers
                   (GlobalConfig *global,CURLM *multi,CURLSH *share,_Bool *morep,_Bool *addedp)

{
  _Bool _Var1;
  CURLcode CVar2;
  CURLcode CVar3;
  int iVar4;
  time_t tVar5;
  long lVar6;
  per_transfer *per;
  _Bool getadded;
  _Bool local_41;
  undefined8 local_40;
  CURLM *local_38;
  
  *addedp = false;
  *morep = false;
  CVar2 = create_transfer(global,share,addedp);
  if (CVar2 == CURLE_OK) {
    CVar2 = CURLE_OK;
    if (transfers == (per_transfer *)0x0) {
      _Var1 = false;
    }
    else {
      local_40 = 0;
      lVar6 = all_added;
      per = transfers;
      local_38 = multi;
      do {
        if (global->parallel_max <= lVar6) {
          local_40 = 1;
          break;
        }
        local_41 = false;
        if (per->added == false) {
          if ((per->startat == 0) || (tVar5 = time((time_t *)0x0), per->startat <= tVar5)) {
            CVar3 = pre_transfer(global,per);
            if (CVar3 != CURLE_OK) {
              return CVar3;
            }
            curl_easy_setopt(per->curl,0xed,global->parallel_connect ^ 1);
            curl_easy_setopt(per->curl,0x2777,per);
            curl_easy_setopt(per->curl,0x4efb,xferinfo_cb);
            curl_easy_setopt(per->curl,0x2749,per);
            iVar4 = curl_multi_add_handle(local_38,per->curl);
            if (iVar4 != 0) {
              return CURLE_OUT_OF_MEMORY;
            }
            CVar3 = create_transfer(global,share,&local_41);
            if (CVar3 != CURLE_OK) {
              return CVar3;
            }
            per->added = true;
            lVar6 = all_added + 1;
            all_added = lVar6;
            *addedp = true;
          }
          else {
            local_40 = CONCAT71((int7)((ulong)tVar5 >> 8),1);
            lVar6 = all_added;
          }
        }
        per = per->next;
      } while (per != (per_transfer *)0x0);
      _Var1 = (_Bool)((byte)local_40 & 1);
    }
    *morep = _Var1;
  }
  return CVar2;
}

Assistant:

static CURLcode add_parallel_transfers(struct GlobalConfig *global,
                                       CURLM *multi,
                                       CURLSH *share,
                                       bool *morep,
                                       bool *addedp)
{
  struct per_transfer *per;
  CURLcode result = CURLE_OK;
  CURLMcode mcode;
  bool sleeping = FALSE;
  *addedp = FALSE;
  *morep = FALSE;
  result = create_transfer(global, share, addedp);
  if(result)
    return result;
  for(per = transfers; per && (all_added < global->parallel_max);
      per = per->next) {
    bool getadded = FALSE;
    if(per->added)
      /* already added */
      continue;
    if(per->startat && (time(NULL) < per->startat)) {
      /* this is still delaying */
      sleeping = TRUE;
      continue;
    }

    result = pre_transfer(global, per);
    if(result)
      return result;

    /* parallel connect means that we don't set PIPEWAIT since pipewait
       will make libcurl prefer multiplexing */
    (void)curl_easy_setopt(per->curl, CURLOPT_PIPEWAIT,
                           global->parallel_connect ? 0L : 1L);
    (void)curl_easy_setopt(per->curl, CURLOPT_PRIVATE, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFOFUNCTION, xferinfo_cb);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFODATA, per);

    mcode = curl_multi_add_handle(multi, per->curl);
    if(mcode)
      return CURLE_OUT_OF_MEMORY;

    result = create_transfer(global, share, &getadded);
    if(result)
      return result;
    per->added = TRUE;
    all_added++;
    *addedp = TRUE;
  }
  *morep = (per || sleeping) ? TRUE : FALSE;
  return CURLE_OK;
}